

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char32_t,char32_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  wchar32 wVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  wchar32 *pwVar5;
  size_t sVar6;
  wchar32 *pwVar7;
  size_t sVar8;
  
  pwVar7 = lhs._M_str;
  sVar8 = lhs._M_len;
  pwVar5 = rhs._M_str;
  sVar6 = rhs._M_len;
  if (sVar8 != sVar6) {
    return false;
  }
  do {
    if ((sVar8 == 0) || (sVar6 == 0)) {
      return sVar8 == 0 && sVar6 == 0;
    }
    wVar1 = *pwVar5;
    if (*pwVar7 == wVar1) {
LAB_0023b000:
      pwVar7 = pwVar7 + 1;
      sVar8 = sVar8 - 1;
      pwVar5 = pwVar5 + 1;
      sVar6 = sVar6 - 1;
      bVar2 = true;
    }
    else {
      iVar3 = jessilib::fold(*pwVar7);
      iVar4 = jessilib::fold(wVar1);
      if (iVar3 == iVar4) goto LAB_0023b000;
      bVar2 = false;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}